

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderHeatmap<int,ImPlot::TransformerLogLog>
               (TransformerLogLog transformer,ImDrawList *DrawList,int *values,int rows,int cols,
               double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max,bool reverse_y)

{
  ImVec2 IVar1;
  undefined8 uVar2;
  int iVar3;
  float fVar4;
  ImPlotPlot *pIVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ImPlotContext *pIVar9;
  ImPlotContext *pIVar10;
  int *piVar11;
  int iVar12;
  ImU32 col;
  ImPlotPoint *pIVar13;
  long lVar14;
  int iVar15;
  ImPlotContext *gp;
  long lVar16;
  ulong uVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  ImVec4 IVar26;
  ImVec2 b;
  ImVec2 a;
  ImVec2 local_190;
  undefined1 local_188 [16];
  undefined8 local_178;
  undefined8 uStack_170;
  ImDrawList *local_168;
  double dStack_160;
  char *local_150;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  double local_118;
  double local_110;
  int *local_108;
  double local_100;
  double local_f8;
  long local_f0;
  long local_e8;
  ulong local_e0;
  double local_d8;
  double local_d0;
  int *local_c8;
  double local_c0;
  RectRenderer<ImPlot::GetterHeatmap<int>,_ImPlot::TransformerLinLin> local_b8;
  undefined1 local_90 [56];
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double dStack_38;
  
  pIVar9 = GImPlot;
  if ((((scale_min == 0.0) && (!NAN(scale_min))) && (scale_max == 0.0)) && (!NAN(scale_max))) {
    iVar12 = *values;
    iVar15 = iVar12;
    if (1 < cols * rows) {
      uVar17 = 1;
      do {
        iVar3 = values[uVar17];
        if (iVar3 < iVar15) {
          iVar15 = iVar3;
        }
        if (iVar12 < iVar3) {
          iVar12 = iVar3;
        }
        uVar17 = uVar17 + 1;
      } while ((uint)(cols * rows) != uVar17);
    }
    scale_min = (double)iVar15;
    scale_max = (double)iVar12;
  }
  local_150 = fmt;
  if ((scale_min != scale_max) || (NAN(scale_min) || NAN(scale_max))) {
    if (reverse_y) {
      dVar24 = -1.0;
      pIVar13 = bounds_max;
    }
    else {
      dVar24 = 1.0;
      pIVar13 = bounds_min;
    }
    local_168 = (ImDrawList *)(double)cols;
    dStack_160 = (double)rows;
    local_100 = pIVar13->y;
    local_90._8_4_ = cols * rows;
    local_58 = bounds_min->x;
    auVar23._0_8_ = bounds_max->x - local_58;
    auVar23._8_8_ = bounds_max->y - bounds_min->y;
    auVar19._8_8_ = dStack_160;
    auVar19._0_8_ = local_168;
    local_90._40_16_ = divpd(auVar23,auVar19);
    local_40 = local_90._40_8_ * 0.5;
    dStack_38 = local_90._48_8_ * 0.5;
    pIVar5 = GImPlot->CurrentPlot;
    fVar4 = (float)pIVar5->CurrentYAxis;
    local_90._0_8_ = values;
    local_90._12_4_ = rows;
    local_90._16_4_ = cols;
    local_90._24_8_ = scale_min;
    local_90._32_8_ = scale_max;
    local_50 = local_100;
    local_48 = dVar24;
    switch(GImPlot->Scales[(int)fVar4]) {
    case 0:
      local_b8.Transformer = (TransformerLinLin *)&local_190;
      local_190.x = fVar4;
      local_b8.Getter = (GetterHeatmap<int> *)local_90;
      local_b8.Prims = local_90._8_4_;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<int>,ImPlot::TransformerLinLin>>
                (&local_b8,DrawList,&pIVar5->PlotRect);
      break;
    case 1:
      local_b8.Transformer = (TransformerLinLin *)&local_190;
      local_190.x = fVar4;
      local_b8.Getter = (GetterHeatmap<int> *)local_90;
      local_b8.Prims = local_90._8_4_;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<int>,ImPlot::TransformerLogLin>>
                ((RectRenderer<ImPlot::GetterHeatmap<int>,_ImPlot::TransformerLogLin> *)&local_b8,
                 DrawList,&pIVar5->PlotRect);
      break;
    case 2:
      local_b8.Transformer = (TransformerLinLin *)&local_190;
      local_190.x = fVar4;
      local_b8.Getter = (GetterHeatmap<int> *)local_90;
      local_b8.Prims = local_90._8_4_;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<int>,ImPlot::TransformerLinLog>>
                ((RectRenderer<ImPlot::GetterHeatmap<int>,_ImPlot::TransformerLinLog> *)&local_b8,
                 DrawList,&pIVar5->PlotRect);
      break;
    case 3:
      local_b8.Transformer = (TransformerLinLin *)&local_190;
      local_190.x = fVar4;
      local_b8.Getter = (GetterHeatmap<int> *)local_90;
      local_b8.Prims = local_90._8_4_;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<int>,ImPlot::TransformerLogLog>>
                ((RectRenderer<ImPlot::GetterHeatmap<int>,_ImPlot::TransformerLogLog> *)&local_b8,
                 DrawList,&pIVar5->PlotRect);
    }
    if ((fmt != (char *)0x0) && (0 < rows)) {
      dVar22 = (bounds_max->x - bounds_min->x) / (double)local_168;
      local_110 = (bounds_max->y - bounds_min->y) / dStack_160;
      lVar14 = (long)transformer.YAxis;
      local_e0 = (ulong)(uint)cols;
      local_118 = local_110 * 0.5;
      dVar25 = dVar22 * 0.5;
      local_f0 = lVar14 << 4;
      local_f8 = 0.0;
      local_13c = 0;
      local_140 = 0;
      local_148 = rows;
      local_144 = cols;
      local_108 = values;
      local_e8 = lVar14;
      local_d8 = dVar25;
      local_d0 = dVar22;
      do {
        if (0 < cols) {
          local_c0 = (local_110 * local_f8 + local_118) * dVar24 + local_100;
          local_c8 = values + local_140;
          local_168 = (ImDrawList *)0x0;
          lVar16 = 0;
          do {
            pIVar9 = GImPlot;
            dVar25 = log10(((double)local_168 * dVar22 + bounds_min->x + dVar25) /
                           (GImPlot->CurrentPlot->XAxis).Range.Min);
            pIVar5 = pIVar9->CurrentPlot;
            local_128._8_4_ = extraout_XMM0_Dc_01;
            local_128._0_8_ = dVar25;
            local_128._12_4_ = extraout_XMM0_Dd_01;
            local_138._8_8_ = 0;
            local_138._0_8_ = pIVar9->LogDenX;
            local_178 = (pIVar5->XAxis).Range.Min;
            uStack_170 = 0;
            local_188._8_8_ = 0;
            local_188._0_8_ = (pIVar5->XAxis).Range.Max;
            dVar25 = log10(local_c0 / pIVar5->YAxis[lVar14].Range.Min);
            piVar11 = local_c8;
            pIVar5 = pIVar9->CurrentPlot;
            auVar21._8_8_ = dVar25;
            auVar21._0_8_ = local_128._0_8_;
            auVar8._8_4_ = SUB84(pIVar9->LogDenY[local_e8],0);
            auVar8._0_8_ = local_138._0_8_;
            auVar8._12_4_ = (int)((ulong)pIVar9->LogDenY[local_e8] >> 0x20);
            auVar19 = divpd(auVar21,auVar8);
            dVar25 = pIVar5->YAxis[lVar14].Range.Min;
            uVar2 = *(undefined8 *)((long)&pIVar9->PixelRange[0].Min.x + local_f0);
            local_178 = (double)CONCAT44((float)(pIVar9->My[local_e8] *
                                                 (((double)(float)auVar19._8_8_ *
                                                   (pIVar5->YAxis[lVar14].Range.Max - dVar25) +
                                                  dVar25) - dVar25) +
                                                (double)(float)((ulong)uVar2 >> 0x20)),
                                         (float)(pIVar9->Mx *
                                                 (((double)(float)auVar19._0_8_ *
                                                   ((double)local_188._0_8_ - local_178) + local_178
                                                  ) - (pIVar5->XAxis).Range.Min) +
                                                (double)(float)uVar2));
            uStack_170 = 0;
            sprintf((char *)&local_b8,local_150,(ulong)(uint)local_c8[lVar16]);
            IVar1 = ImGui::CalcTextSize((char *)&local_b8,(char *)0x0,false,-1.0);
            local_188._8_4_ = extraout_XMM0_Dc_02;
            local_188._0_4_ = IVar1.x;
            local_188._4_4_ = IVar1.y;
            local_188._12_4_ = extraout_XMM0_Dd_02;
            dVar25 = ((double)piVar11[lVar16] - scale_min) / (scale_max - scale_min);
            dVar22 = 1.0;
            if (dVar25 <= 1.0) {
              dVar22 = dVar25;
            }
            IVar26 = SampleColormap((float)(double)(~-(ulong)(dVar25 < 0.0) & (ulong)dVar22),-1);
            local_190.y = (float)local_188._4_4_ * -0.5 + local_178._4_4_;
            local_190.x = (float)local_188._0_4_ * -0.5 + (float)local_178;
            ImDrawList::AddText(DrawList,&local_190,
                                -(uint)(IVar26.z * 0.114 + IVar26.x * 0.299 + IVar26.y * 0.587 <=
                                       0.5) | 0xff000000,(char *)&local_b8,(char *)0x0);
            local_168 = (ImDrawList *)((double)local_168 + 1.0);
            lVar16 = lVar16 + 1;
            dVar25 = local_d8;
            dVar22 = local_d0;
          } while ((int)local_e0 != (int)lVar16);
          local_140 = local_140 + (int)lVar16;
          values = local_108;
          rows = local_148;
          cols = local_144;
        }
        local_f8 = local_f8 + 1.0;
        local_13c = local_13c + 1;
      } while (local_13c != rows);
    }
  }
  else {
    dVar24 = log10(bounds_min->x / (GImPlot->CurrentPlot->XAxis).Range.Min);
    pIVar5 = pIVar9->CurrentPlot;
    local_138._8_4_ = extraout_XMM0_Dc;
    local_138._0_8_ = dVar24;
    local_138._12_4_ = extraout_XMM0_Dd;
    local_188._8_8_ = 0;
    local_188._0_8_ = pIVar9->LogDenX;
    local_168 = (ImDrawList *)(pIVar5->XAxis).Range.Min;
    dStack_160 = 0.0;
    local_178 = (pIVar5->XAxis).Range.Max;
    uStack_170 = 0;
    dVar24 = log10(bounds_min->y / pIVar5->YAxis[transformer.YAxis].Range.Min);
    pIVar10 = GImPlot;
    pIVar5 = pIVar9->CurrentPlot;
    auVar18._8_8_ = dVar24;
    auVar18._0_8_ = local_138._0_8_;
    auVar6._8_4_ = SUB84(pIVar9->LogDenY[transformer.YAxis],0);
    auVar6._0_8_ = local_188._0_8_;
    auVar6._12_4_ = (int)((ulong)pIVar9->LogDenY[transformer.YAxis] >> 0x20);
    auVar19 = divpd(auVar18,auVar6);
    dVar24 = pIVar5->YAxis[transformer.YAxis].Range.Min;
    IVar1 = pIVar9->PixelRange[transformer.YAxis].Min;
    local_90._4_4_ =
         (float)(pIVar9->My[transformer.YAxis] *
                 (((double)(float)auVar19._8_8_ *
                   (pIVar5->YAxis[transformer.YAxis].Range.Max - dVar24) + dVar24) - dVar24) +
                (double)IVar1.y);
    local_90._0_4_ =
         (float)(pIVar9->Mx *
                 (((double)(float)auVar19._0_8_ * (local_178 - (double)local_168) +
                  (double)local_168) - (pIVar5->XAxis).Range.Min) + (double)IVar1.x);
    local_168 = DrawList;
    dVar24 = log10(bounds_max->x / (GImPlot->CurrentPlot->XAxis).Range.Min);
    pIVar5 = pIVar10->CurrentPlot;
    local_128._8_4_ = extraout_XMM0_Dc_00;
    local_128._0_8_ = dVar24;
    local_128._12_4_ = extraout_XMM0_Dd_00;
    local_138._8_8_ = 0;
    local_138._0_8_ = pIVar10->LogDenX;
    local_178 = (pIVar5->XAxis).Range.Min;
    uStack_170 = 0;
    local_188._8_8_ = 0;
    local_188._0_8_ = (pIVar5->XAxis).Range.Max;
    dVar24 = log10(bounds_max->y / pIVar5->YAxis[transformer.YAxis].Range.Min);
    pIVar5 = pIVar10->CurrentPlot;
    auVar20._8_8_ = dVar24;
    auVar20._0_8_ = local_128._0_8_;
    auVar7._8_4_ = SUB84(pIVar10->LogDenY[transformer.YAxis],0);
    auVar7._0_8_ = local_138._0_8_;
    auVar7._12_4_ = (int)((ulong)pIVar10->LogDenY[transformer.YAxis] >> 0x20);
    auVar19 = divpd(auVar20,auVar7);
    dVar24 = pIVar5->YAxis[transformer.YAxis].Range.Min;
    IVar1 = pIVar10->PixelRange[transformer.YAxis].Min;
    local_b8.Getter =
         (GetterHeatmap<int> *)
         CONCAT44((float)(pIVar10->My[transformer.YAxis] *
                          (((double)(float)auVar19._8_8_ *
                            (pIVar5->YAxis[transformer.YAxis].Range.Max - dVar24) + dVar24) - dVar24
                          ) + (double)IVar1.y),
                  (float)(pIVar10->Mx *
                          (((double)(float)auVar19._0_8_ * ((double)local_188._0_8_ - local_178) +
                           local_178) - (pIVar5->XAxis).Range.Min) + (double)IVar1.x));
    col = GetColormapColorU32(0,(pIVar9->Style).Colormap);
    ImDrawList::AddRectFilled(local_168,(ImVec2 *)local_90,(ImVec2 *)&local_b8,col,0.0,0);
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max, bool reverse_y) {
    ImPlotContext& gp = *GImPlot;
    if (scale_min == 0 && scale_max == 0) {
        T temp_min, temp_max;
        ImMinMaxArray(values,rows*cols,&temp_min,&temp_max);
        scale_min = (double)temp_min;
        scale_max = (double)temp_max;
    }
    if (scale_min == scale_max) {
        ImVec2 a = transformer(bounds_min);
        ImVec2 b = transformer(bounds_max);
        ImU32  col = GetColormapColorU32(0,gp.Style.Colormap);
        DrawList.AddRectFilled(a, b, col);
        return;
    }
    const double yref = reverse_y ? bounds_max.y : bounds_min.y;
    const double ydir = reverse_y ? -1 : 1;
    GetterHeatmap<T> getter(values, rows, cols, scale_min, scale_max, (bounds_max.x - bounds_min.x) / cols, (bounds_max.y - bounds_min.y) / rows, bounds_min.x, yref, ydir);
    switch (GetCurrentScale()) {
        case ImPlotScale_LinLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLin>(getter, TransformerLinLin()), DrawList, gp.CurrentPlot->PlotRect); break;
        case ImPlotScale_LogLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLin>(getter, TransformerLogLin()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LinLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLog>(getter, TransformerLinLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LogLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLog>(getter, TransformerLogLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
    }
    if (fmt != NULL) {
        const double w = (bounds_max.x - bounds_min.x) / cols;
        const double h = (bounds_max.y - bounds_min.y) / rows;
        const ImPlotPoint half_size(w*0.5,h*0.5);
        int i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = yref + ydir * (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImClamp(ImRemap01((double)values[i], scale_min, scale_max),0.0,1.0);
                ImVec4 color = SampleColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}